

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::setCallbackFunctions(TutorialApplication *this,GLFWwindow *window)

{
  GLFWkeyfun in_RSI;
  GLFWwindow *in_RDI;
  GLFWmonitorfun in_stack_ffffffffffffffe8;
  
  glfwSetKeyCallback(in_RDI,in_RSI);
  glfwSetCursorPosCallback(in_RDI,(GLFWcursorposfun)in_RSI);
  glfwSetMouseButtonCallback(in_RDI,(GLFWmousebuttonfun)in_RSI);
  glfwSetCharCallback(in_RDI,(GLFWcharfun)in_RSI);
  glfwSetScrollCallback(in_RDI,(GLFWscrollfun)in_RSI);
  glfwSetWindowSizeCallback(in_RDI,(GLFWwindowsizefun)in_RSI);
  glfwSetWindowFocusCallback(in_RDI,(GLFWwindowfocusfun)in_RSI);
  glfwSetCursorEnterCallback(in_RDI,(GLFWcursorenterfun)in_RSI);
  glfwSetMonitorCallback(in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void TutorialApplication::setCallbackFunctions(GLFWwindow* window)
  {
    glfwSetKeyCallback(window,embree::keyboardFunc);
    glfwSetCursorPosCallback(window,embree::motionFunc);
    glfwSetMouseButtonCallback(window,embree::clickFunc);
    glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
    glfwSetWindowSizeCallback(window,embree::reshapeFunc);
    glfwSetWindowFocusCallback(window, ImGui_ImplGlfw_WindowFocusCallback);
    glfwSetCursorEnterCallback(window, ImGui_ImplGlfw_CursorEnterCallback);
    glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
  }